

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O2

void __thiscall
UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
          (reverse_lock *this,UniqueLock<AnnotatedMixin<std::mutex>_> *_lock,char *_guardname,
          char *_file,int _line)

{
  bool bVar1;
  UniqueLock<AnnotatedMixin<std::mutex>_> *pUVar2;
  mutex_type *pmVar3;
  long in_FS_OFFSET;
  allocator<char> local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this->lock = _lock;
  (this->templock).super_unique_lock._M_device = (mutex_type *)0x0;
  (this->templock).super_unique_lock._M_owns = false;
  (this->lockname)._M_dataplus._M_p = (pointer)&(this->lockname).field_2;
  (this->lockname)._M_string_length = 0;
  (this->lockname).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->file,_file,&local_29);
  this->line = _line;
  std::unique_lock<std::mutex>::unlock(&this->lock->super_unique_lock);
  pUVar2 = this->lock;
  pmVar3 = (pUVar2->super_unique_lock)._M_device;
  (pUVar2->super_unique_lock)._M_device = (this->templock).super_unique_lock._M_device;
  (this->templock).super_unique_lock._M_device = pmVar3;
  bVar1 = (pUVar2->super_unique_lock)._M_owns;
  (pUVar2->super_unique_lock)._M_owns = (this->templock).super_unique_lock._M_owns;
  (this->templock).super_unique_lock._M_owns = bVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit reverse_lock(UniqueLock& _lock, const char* _guardname, const char* _file, int _line) : lock(_lock), file(_file), line(_line) {
            CheckLastCritical((void*)lock.mutex(), lockname, _guardname, _file, _line);
            lock.unlock();
            LeaveCritical();
            lock.swap(templock);
        }